

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

QMultiMap<QByteArray,_int> * __thiscall
QMap<int,_QMultiMap<QByteArray,_int>_>::operator[]
          (QMap<int,_QMultiMap<QByteArray,_int>_> *this,int *key)

{
  bool bVar1;
  pointer ppVar2;
  pair<const_int,_QMultiMap<QByteArray,_int>_> *in_RSI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>,_bool> pVar3;
  iterator i;
  QMap<int,_QMultiMap<QByteArray,_int>_> copy;
  map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>
  *in_stack_ffffffffffffff68;
  QMultiMap<QByteArray,_int> *pQVar4;
  QMap<int,_QMultiMap<QByteArray,_int>_> *in_stack_ffffffffffffff70;
  map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>
  *this_00;
  map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>
  local_48;
  _Base_ptr local_18;
  undefined1 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  bVar1 = QtPrivate::
          QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>_>
          ::isShared(&in_stack_ffffffffffffff70->d);
  if (bVar1) {
    QMap(in_stack_ffffffffffffff70,
         (QMap<int,_QMultiMap<QByteArray,_int>_> *)in_stack_ffffffffffffff68);
  }
  else {
    memset(&local_48._M_t._M_impl.super__Rb_tree_header._M_node_count,0,8);
    QMap((QMap<int,_QMultiMap<QByteArray,_int>_> *)0x116233);
  }
  detach(in_stack_ffffffffffffff70);
  local_48._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>_>
  ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>_>
                *)0x116253);
  local_48._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)
       std::
       map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>
       ::find(in_stack_ffffffffffffff68,(key_type *)0x116264);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>_>
  ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>_>
                *)0x116273);
  local_48._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)
       std::
       map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>
       ::end(in_stack_ffffffffffffff68);
  bVar1 = std::operator==((_Self *)&local_48._M_t._M_impl.super__Rb_tree_header._M_header._M_right,
                          (_Self *)&local_48._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
  if (bVar1) {
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>_>
    ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>_>
                  *)0x1162a6);
    local_48._M_t._M_impl._0_8_ = 0;
    this_00 = &local_48;
    QMultiMap<QByteArray,_int>::QMultiMap((QMultiMap<QByteArray,_int> *)0x1162d1);
    std::pair<const_int,_QMultiMap<QByteArray,_int>_>::pair<QMultiMap<QByteArray,_int>,_true>
              (in_RSI,(int *)in_stack_ffffffffffffff68,(QMultiMap<QByteArray,_int> *)0x1162ea);
    pVar3 = std::
            map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>
            ::insert(this_00,in_RSI);
    local_48._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)pVar3.first._M_node;
    local_10 = pVar3.second;
    local_18 = local_48._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
    std::pair<const_int,_QMultiMap<QByteArray,_int>_>::~pair
              ((pair<const_int,_QMultiMap<QByteArray,_int>_> *)0x116331);
    QMultiMap<QByteArray,_int>::~QMultiMap((QMultiMap<QByteArray,_int> *)0x11633b);
  }
  ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>::operator->
                     ((_Rb_tree_iterator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_> *)
                      0x116345);
  pQVar4 = &ppVar2->second;
  ~QMap((QMap<int,_QMultiMap<QByteArray,_int>_> *)0x116357);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return pQVar4;
}

Assistant:

T &operator[](const Key &key)
    {
        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        detach();
        auto i = d->m.find(key);
        if (i == d->m.end())
            i = d->m.insert({key, T()}).first;
        return i->second;
    }